

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_not(void)

{
  byte bVar1;
  undefined4 *puVar2;
  byte bVar3;
  ushort pram;
  uint pram_00;
  
  bVar3 = code_ptr[registe_ptr->IP + 1];
  bVar1 = bVar3 >> 4;
  if ((bVar3 & 0xf) == 2) {
    pram_00 = ~*register_list[bVar1];
    *register_list[bVar1] = pram_00;
    set_flag(pram_00);
  }
  else if ((bVar3 & 0xf) == 1) {
    pram = ~(ushort)*register_list[bVar1];
    *(ushort *)register_list[bVar1] = pram;
    set_flag(pram);
  }
  else {
    if ((bVar3 & 0xf) != 0) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0xf6;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    bVar3 = ~(byte)*register_list[bVar1];
    *(byte *)register_list[bVar1] = bVar3;
    set_flag(bVar3);
  }
  return 1;
}

Assistant:

int do_not(){
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 1] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;
	if (low == 0) {
		char*Ra = (char *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else if (low == 1)
	{
		int16_t*Ra = (int16_t *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else if (low == 2)
	{
		unsigned*Ra = (unsigned *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}